

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Monomorphize.cpp
# Opt level: O0

Pass * wasm::createMonomorphizeAlwaysPass(void)

{
  Monomorphize *this;
  
  this = (Monomorphize *)operator_new(0x98);
  anon_unknown_0::Monomorphize::Monomorphize(this,false);
  return &this->super_Pass;
}

Assistant:

Pass* createMonomorphizeAlwaysPass() { return new Monomorphize(false); }